

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# retDelay.c
# Opt level: O0

int Abc_NtkRetimeMinDelay
              (Abc_Ntk_t *pNtk,Abc_Ntk_t *pNtkCopy,int nDelayLim,int nIterLimit,int fForward,
              int fVerbose)

{
  int iVar1;
  int local_3c;
  int DelayBest2;
  int IterBest2;
  int DelayBest;
  int IterBest;
  int fVerbose_local;
  int fForward_local;
  int nIterLimit_local;
  int nDelayLim_local;
  Abc_Ntk_t *pNtkCopy_local;
  Abc_Ntk_t *pNtk_local;
  
  DelayBest = fVerbose;
  IterBest = fForward;
  fVerbose_local = nIterLimit;
  fForward_local = nDelayLim;
  _nIterLimit_local = pNtkCopy;
  pNtkCopy_local = pNtk;
  DelayBest2 = Abc_NtkRetimeMinDelayTry
                         (pNtkCopy,nDelayLim,fForward,0,nIterLimit,&IterBest2,fVerbose);
  if (IterBest2 != 0) {
    iVar1 = Abc_NtkRetimeMinDelayTry
                      (pNtkCopy_local,fForward_local,IterBest,1,IterBest2,&local_3c,DelayBest);
    if (DelayBest2 != iVar1) {
      __assert_fail("DelayBest == DelayBest2",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/ret/retDelay.c"
                    ,0x3c,"int Abc_NtkRetimeMinDelay(Abc_Ntk_t *, Abc_Ntk_t *, int, int, int, int)")
      ;
    }
    if (IterBest2 != local_3c) {
      __assert_fail("IterBest == IterBest2",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/ret/retDelay.c"
                    ,0x3d,"int Abc_NtkRetimeMinDelay(Abc_Ntk_t *, Abc_Ntk_t *, int, int, int, int)")
      ;
    }
  }
  return 1;
}

Assistant:

int Abc_NtkRetimeMinDelay( Abc_Ntk_t * pNtk, Abc_Ntk_t * pNtkCopy, int nDelayLim, int nIterLimit, int fForward, int fVerbose )
{
    int IterBest, DelayBest;
    int IterBest2, DelayBest2;
    // try to find the best delay iteration on a copy
    DelayBest = Abc_NtkRetimeMinDelayTry( pNtkCopy, nDelayLim, fForward, 0, nIterLimit, &IterBest, fVerbose );
    if ( IterBest == 0 )
        return 1;
    // perform the given number of iterations on the original network
    DelayBest2 = Abc_NtkRetimeMinDelayTry( pNtk, nDelayLim, fForward, 1, IterBest, &IterBest2, fVerbose );
    assert( DelayBest == DelayBest2 );
    assert( IterBest == IterBest2 );
    return 1;
}